

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

iterator __thiscall mpt::span<const_int>::nth(span<const_int> *this,long pos)

{
  ulong uVar1;
  
  uVar1 = this->_len >> 2;
  if (pos < 0) {
    pos = pos + uVar1;
    if (-1 < pos) goto LAB_00102485;
  }
  else if ((ulong)pos < uVar1) {
LAB_00102485:
    return this->_base + pos;
  }
  return (iterator)0x0;
}

Assistant:

inline iterator nth(long pos) const
	{
		if (pos < 0) {
			if ((pos += size()) < 0) {
				return 0;
			}
		}
		else if (pos >= size()) {
			return 0;
		}
		return _base + pos;
	}